

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

void Bus_SclInsertFanout(Vec_Ptr_t *vFanouts,Abc_Obj_t *pObj)

{
  size_t __size;
  ulong uVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  void **ppvVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  Abc_Obj_t *pCur;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  uVar2 = vFanouts->nSize;
  local_40 = pObj;
  if ((long)(int)uVar2 < 1) {
    uVar10 = 0;
  }
  else {
    lVar7 = 0;
    uVar10 = 0;
    do {
      pvVar3 = vFanouts->pArray[lVar7];
      if (pvVar3 != (void *)0x0) {
        if (((int)uVar10 < 0) || (uVar2 <= uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar9 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        vFanouts->pArray[uVar9] = pvVar3;
      }
      lVar7 = lVar7 + 1;
    } while ((int)uVar2 != lVar7);
  }
  if ((int)uVar2 < (int)uVar10) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  vFanouts->nSize = uVar10;
  if (uVar10 == vFanouts->nCap) {
    if ((int)uVar10 < 0x10) {
      if (vFanouts->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vFanouts->pArray,0x80);
      }
      vFanouts->pArray = ppvVar6;
      vFanouts->nCap = 0x10;
    }
    else {
      __size = (ulong)(uVar10 * 2) * 8;
      if (vFanouts->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(__size);
      }
      else {
        ppvVar6 = (void **)realloc(vFanouts->pArray,__size);
      }
      vFanouts->pArray = ppvVar6;
      vFanouts->nCap = uVar10 * 2;
    }
  }
  else {
    ppvVar6 = vFanouts->pArray;
  }
  uVar9 = (ulong)vFanouts->nSize;
  vFanouts->nSize = vFanouts->nSize + 1;
  ppvVar6[uVar9] = pObj;
  if (0 < (long)uVar9) {
    do {
      uVar1 = uVar9 - 1;
      if (vFanouts->nSize <= (int)uVar1) {
LAB_0045900d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar8 = uVar1 & 0xffffffff;
      local_38 = (Abc_Obj_t *)vFanouts->pArray[uVar8];
      if ((uint)vFanouts->nSize <= uVar9) goto LAB_0045900d;
      local_40 = (Abc_Obj_t *)vFanouts->pArray[uVar9];
      iVar5 = Bus_SclCompareFanouts(&local_38,&local_40);
      if (iVar5 == -1) {
        return;
      }
      ppvVar6 = vFanouts->pArray;
      pvVar3 = ppvVar6[uVar8];
      ppvVar6[uVar8] = ppvVar6[uVar9];
      vFanouts->pArray[uVar9] = pvVar3;
      bVar4 = 1 < (long)uVar9;
      uVar9 = uVar1;
    } while (bVar4);
  }
  return;
}

Assistant:

void Bus_SclInsertFanout( Vec_Ptr_t * vFanouts, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pCur;
    int i, k;
    // compact array
    for ( i = k = 0; i < Vec_PtrSize(vFanouts); i++ )
        if ( Vec_PtrEntry(vFanouts, i) != NULL )
            Vec_PtrWriteEntry( vFanouts, k++, Vec_PtrEntry(vFanouts, i) );
    Vec_PtrShrink( vFanouts, k );
    // insert new entry
    Vec_PtrPush( vFanouts, pObj );
    for ( i = Vec_PtrSize(vFanouts) - 1; i > 0; i-- )
    {
        pCur = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i-1);
        pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i);
        if ( Bus_SclCompareFanouts( &pCur, &pObj ) == -1 )
            break;
        ABC_SWAP( void *, Vec_PtrArray(vFanouts)[i-1], Vec_PtrArray(vFanouts)[i] );
    }
}